

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O0

void hyb_gga_xc_hjs_init(xc_func_type *p)

{
  int *funcs_id;
  xc_func_type *in_RDI;
  xc_func_type *unaff_retaddr;
  double *in_stack_ffffffffffffffe8;
  
  funcs_id = (int *)(ulong)(in_RDI->info->number - 0x1ad);
  switch(funcs_id) {
  case (int *)0x0:
    hyb_gga_xc_hjs_init::funcs_id[1] = 0x20d;
    hyb_gga_xc_hjs_init::funcs_id[0] = 0x20d;
    break;
  case (int *)0x1:
    hyb_gga_xc_hjs_init::funcs_id[1] = 0x20e;
    hyb_gga_xc_hjs_init::funcs_id[0] = 0x20e;
    break;
  case (int *)0x2:
    hyb_gga_xc_hjs_init::funcs_id[1] = 0x20f;
    hyb_gga_xc_hjs_init::funcs_id[0] = 0x20f;
    break;
  case (int *)0x3:
    hyb_gga_xc_hjs_init::funcs_id[1] = 0x210;
    hyb_gga_xc_hjs_init::funcs_id[0] = 0x210;
    break;
  default:
    fprintf(_stderr,"Internal error in hyb_gga_xc_hjs\n");
    exit(1);
  }
  xc_mix_init(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),funcs_id,in_stack_ffffffffffffffe8);
  xc_hyb_init_sr(in_RDI,0.25,0.11);
  xc_func_set_ext_params_name(unaff_retaddr,(char *)in_RDI,(double)funcs_id);
  xc_func_set_ext_params_name(unaff_retaddr,(char *)in_RDI,(double)funcs_id);
  return;
}

Assistant:

static void
hyb_gga_xc_hjs_init(xc_func_type *p)
{
  static int   funcs_id  [3] = {-1, -1, XC_GGA_C_PBE};
  static double funcs_coef[3] = {1.0, -0.25, 1.0};

  switch(p->info->number){
  case XC_HYB_GGA_XC_HJS_PBE:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_PBE;
    break;
  case XC_HYB_GGA_XC_HJS_PBE_SOL:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_PBE_SOL;
    break;
  case XC_HYB_GGA_XC_HJS_B88:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_B88;
    break;
  case XC_HYB_GGA_XC_HJS_B97X:
    funcs_id[0] = funcs_id[1] = XC_GGA_X_HJS_B97X;
    break;
  default:
    fprintf(stderr, "Internal error in hyb_gga_xc_hjs\n");
    exit(1);
  }

  xc_mix_init(p, 3, funcs_id, funcs_coef);
  xc_hyb_init_sr(p, 0.25, 0.11);

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", p->cam_omega);
}